

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_Proto3RequiredFields_Test::TestBody
          (ValidationErrorTest_Proto3RequiredFields_Test *this)

{
  string_view file_text;
  allocator<char> local_59;
  string local_58;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   field { name:\'foo\' number:1 label:LABEL_REQUIRED type:TYPE_INT32 } }"
             ,&local_59);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_20,"foo.proto: Foo.foo: TYPE: Required fields are not allowed in proto3.\n");
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_58,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_20);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_20);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   nested_type {     name : \'Bar\'     field { name:\'bar\' number:1 label:LABEL_REQUIRED type:TYPE_INT32 }   } }"
             ,&local_59);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_38,
            "foo.proto: Foo.Bar.bar: TYPE: Required fields are not allowed in proto3.\n");
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_58,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  file_text._M_str =
       "name: \'foo.proto\' syntax: \'proto3\' message_type {   name: \'Foo\'   field { name:\'foo\' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 }   field { name:\'bar\' number:2 label:LABEL_REPEATED type:TYPE_INT32 } }"
  ;
  file_text._M_len = 0xcb;
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, Proto3RequiredFields) {
  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  field { name:'foo' number:1 label:LABEL_REQUIRED type:TYPE_INT32 } "
      "}",
      "foo.proto: Foo.foo: TYPE: Required fields are not allowed in "
      "proto3.\n");

  // applied to nested types as well.
  BuildFileWithErrors(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  nested_type { "
      "    name : 'Bar' "
      "    field { name:'bar' number:1 label:LABEL_REQUIRED type:TYPE_INT32 } "
      "  } "
      "}",
      "foo.proto: Foo.Bar.bar: TYPE: Required fields are not allowed in "
      "proto3.\n");

  // optional and repeated fields are OK.
  BuildFile(
      "name: 'foo.proto' "
      "syntax: 'proto3' "
      "message_type { "
      "  name: 'Foo' "
      "  field { name:'foo' number:1 label:LABEL_OPTIONAL type:TYPE_INT32 } "
      "  field { name:'bar' number:2 label:LABEL_REPEATED type:TYPE_INT32 } "
      "}");
}